

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Opnd.cpp
# Opt level: O2

PropertySymOpnd * __thiscall IR::PropertySymOpnd::CopyCommon(PropertySymOpnd *this,Func *func)

{
  PropertySym *propertySym;
  PropertySymOpnd *pPVar1;
  
  propertySym = Sym::AsPropertySym((this->super_SymOpnd).m_sym);
  pPVar1 = New(propertySym,(this->super_SymOpnd).super_Opnd.m_type,func);
  (pPVar1->super_SymOpnd).super_Opnd.m_valueType.field_0 =
       (this->super_SymOpnd).super_Opnd.m_valueType.field_0;
  pPVar1->m_inlineCacheIndex = this->m_inlineCacheIndex;
  pPVar1->m_runtimeInlineCache = this->m_runtimeInlineCache;
  pPVar1->m_runtimePolymorphicInlineCache = this->m_runtimePolymorphicInlineCache;
  (pPVar1->super_SymOpnd).super_Opnd.field_0xb =
       (pPVar1->super_SymOpnd).super_Opnd.field_0xb & 0xef |
       (this->super_SymOpnd).super_Opnd.field_0xb & 0x10;
  return pPVar1;
}

Assistant:

PropertySymOpnd *
PropertySymOpnd::CopyCommon(Func *func)
{
    PropertySymOpnd *newOpnd = PropertySymOpnd::New(this->m_sym->AsPropertySym(), this->m_type, func);
    newOpnd->m_valueType = this->m_valueType;
    newOpnd->m_inlineCacheIndex = this->m_inlineCacheIndex;
    newOpnd->m_runtimeInlineCache = this->m_runtimeInlineCache;
    newOpnd->m_runtimePolymorphicInlineCache = this->m_runtimePolymorphicInlineCache;
    newOpnd->canStoreTemp = this->canStoreTemp;
    return newOpnd;
}